

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AmpIO.cpp
# Opt level: O0

uint8_t __thiscall AmpIO::GetEncoderChannelB(AmpIO *this)

{
  uint32_t uVar1;
  uint local_18;
  byte local_11;
  uint i;
  uint8_t encB;
  AmpIO *this_local;
  
  uVar1 = BoardIO::GetHardwareVersion((BoardIO *)this);
  if (uVar1 == 0x44514c41) {
    local_11 = 0;
    for (local_18 = 0; local_18 < this->NumEncoders; local_18 = local_18 + 1) {
      if ((this->ReadBuffer[this->ENC_POS_OFFSET + local_18] & 0x20000000) != 0) {
        local_11 = local_11 | (byte)(1 << ((byte)local_18 & 0x1f));
      }
    }
  }
  else {
    uVar1 = GetDigitalInput(this);
    local_11 = (byte)((uVar1 & 0xf00000) >> 0x14);
  }
  return local_11;
}

Assistant:

uint8_t AmpIO::GetEncoderChannelB(void) const
{
    uint8_t encB;
    if (GetHardwareVersion() == DQLA_String) {
        // This also works for QLA with Rev 8+
        encB = 0;
        for (unsigned int i = 0; i < NumEncoders; i++) {
            if (ReadBuffer[ENC_POS_OFFSET+i]&ENC_B_MASK)
                encB |= (1 << i);
        }
    }
    else {
        encB =  static_cast<uint8_t>((this->GetDigitalInput()&0x00f00000)>>20);
    }
    return encB;
}